

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O0

int __thiscall
deqp::egl::anon_unknown_0::SwapBuffersWithDamageTest::init
          (SwapBuffersWithDamageTest *this,EVP_PKEY_CTX *ctx)

{
  EglTestContext *this_00;
  int iVar1;
  ApiType apiType;
  Library *pLVar2;
  NativeDisplay *nativeDisplay;
  EGLDisplay pvVar3;
  undefined4 extraout_var;
  GLES2Renderer *this_01;
  Library *egl;
  SwapBuffersWithDamageTest *this_local;
  
  pLVar2 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  nativeDisplay = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  pvVar3 = eglu::getAndInitDisplay(nativeDisplay,(Version *)0x0);
  this->m_eglDisplay = pvVar3;
  iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                    (this,pLVar2,this->m_eglDisplay);
  this->m_eglConfig = (EGLConfig)CONCAT44(extraout_var,iVar1);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,pLVar2,this->m_eglDisplay);
  initEGLSurface(this,this->m_eglConfig);
  initEGLContext(this,this->m_eglConfig);
  this_00 = (this->super_TestCase).m_eglTestCtx;
  apiType = glu::ApiType::es(2,0);
  EglTestContext::initGLFunctions(this_00,&this->m_gl,apiType);
  this_01 = (GLES2Renderer *)operator_new(0xe0);
  GLES2Renderer::GLES2Renderer(this_01,&this->m_gl);
  this->m_gles2Renderer = this_01;
  return (int)this;
}

Assistant:

void SwapBuffersWithDamageTest::init (void)
{
	const Library& egl = m_eglTestCtx.getLibrary();

	m_eglDisplay = eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_eglConfig  = getConfig(egl, m_eglDisplay);

	checkExtension(egl, m_eglDisplay);

	initEGLSurface(m_eglConfig);
	initEGLContext(m_eglConfig);

	m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2,0));
	m_gles2Renderer = new GLES2Renderer(m_gl);
}